

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

ncnn_datareader_t ncnn_datareader_create_from_memory(uchar **mem)

{
  ncnn_datareader_t p_Var1;
  uchar **mem_00;
  ncnn_datareader_t dr;
  ncnn_datareader_t _dr;
  DataReaderFromMemory_c_api *in_stack_ffffffffffffffe0;
  
  _dr = (ncnn_datareader_t)&DAT_00000018;
  p_Var1 = (ncnn_datareader_t)malloc(0x18);
  mem_00 = (uchar **)operator_new((ulong)_dr);
  DataReaderFromMemory_c_api::DataReaderFromMemory_c_api(in_stack_ffffffffffffffe0,mem_00,_dr);
  p_Var1->pthis = mem_00;
  p_Var1->scan = __ncnn_DataReaderFromMemory_scan;
  p_Var1->read = __ncnn_DataReaderFromMemory_read;
  return p_Var1;
}

Assistant:

ncnn_datareader_t ncnn_datareader_create_from_memory(const unsigned char** mem)
{
    ncnn_datareader_t dr = (ncnn_datareader_t)malloc(sizeof(struct __ncnn_datareader_t));
    dr->pthis = (void*)(new DataReaderFromMemory_c_api(*mem, dr));
#if NCNN_STRING
    dr->scan = __ncnn_DataReaderFromMemory_scan;
#endif /* NCNN_STRING */
    dr->read = __ncnn_DataReaderFromMemory_read;
    return dr;
}